

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O2

CFG * __thiscall PDA::toCFG(PDA *this)

{
  CFG *this_00;
  PDA *this_01;
  allocator<char> local_91;
  _Vector_base<char,_std::allocator<char>_> local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strVec;
  vector<Production_*,_std::allocator<Production_*>_> r;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  string local_30;
  
  getCFGVariables_abi_cxx11_(&v,this);
  getCFGProductions(&r,this);
  this_01 = (PDA *)&this->inputAlphabetS;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_90,
             (vector<char,_std::allocator<char>_> *)this_01);
  toVecStr_abi_cxx11_(&strVec,this_01,(vector<char,_std::allocator<char>_> *)&local_90);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_90);
  this_00 = (CFG *)operator_new(0x68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"S",&local_91);
  CFG::CFG(this_00,&v,&strVec,&r,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&strVec);
  std::_Vector_base<Production_*,_std::allocator<Production_*>_>::~_Vector_base
            (&r.super__Vector_base<Production_*,_std::allocator<Production_*>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v);
  return this_00;
}

Assistant:

CFG *PDA::toCFG() {
    std::vector<std::string> v = getCFGVariables(); // set of variables
    std::vector<Production*> r = getCFGProductions();

    std::vector<std::string> strVec = toVecStr(inputAlphabetS);
    CFG* cfg = new CFG(v, strVec, r, "S");
    return cfg;
}